

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

_Bool file_stdio_fseek(ALLEGRO_FILE *f,int64_t offset,int whence)

{
  int errnum;
  USERDATA *pUVar1;
  int *piVar2;
  int in_EDX;
  __off_t in_RSI;
  bool bVar3;
  int rc;
  USERDATA *userdata;
  ALLEGRO_FILE *in_stack_ffffffffffffffc8;
  int local_1c;
  
  pUVar1 = get_userdata(in_stack_ffffffffffffffc8);
  if (in_EDX == 0) {
    local_1c = 0;
  }
  else if (in_EDX == 1) {
    local_1c = 1;
  }
  else {
    local_1c = in_EDX;
    if (in_EDX == 2) {
      local_1c = 2;
    }
  }
  errnum = fseeko((FILE *)pUVar1->fp,in_RSI,local_1c);
  bVar3 = errnum != -1;
  if (!bVar3) {
    piVar2 = __errno_location();
    pUVar1->errnum = *piVar2;
    __errno_location();
    al_set_errno(errnum);
  }
  return bVar3;
}

Assistant:

static bool file_stdio_fseek(ALLEGRO_FILE *f, int64_t offset,
   int whence)
{
   USERDATA *userdata = get_userdata(f);
   int rc;

   switch (whence) {
      case ALLEGRO_SEEK_SET: whence = SEEK_SET; break;
      case ALLEGRO_SEEK_CUR: whence = SEEK_CUR; break;
      case ALLEGRO_SEEK_END: whence = SEEK_END; break;
   }

#if defined(ALLEGRO_HAVE_FSEEKO)
   rc = fseeko(userdata->fp, offset, whence);
#elif defined(ALLEGRO_HAVE_FSEEKI64)
   rc = _fseeki64(userdata->fp, offset, whence);
#else
   rc = fseek(userdata->fp, offset, whence);
#endif

   if (rc == -1) {
      userdata->errnum = errno;
      al_set_errno(errno);
      return false;
   }

   return true;
}